

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_apply_refine(lysc_ctx *ctx,lysp_refine *rfn,lysp_module *rfn_pmod,lysp_node *target)

{
  uint16_t uVar1;
  lys_module *plVar2;
  lysp_module *plVar3;
  ly_ctx *plVar4;
  lysp_node *plVar5;
  lysp_ext_instance *plVar6;
  long lVar7;
  uint uVar8;
  ly_stmt parent_stmt;
  LY_ERR LVar9;
  lysp_qname *plVar10;
  char *pcVar11;
  lysp_node *plVar12;
  lysp_ext_instance *local_1e8;
  lysp_ext_instance *local_1d8;
  lysp_ext_instance *local_1c8;
  lysp_ext_instance *local_1c0;
  lysp_ext_instance *local_1a8;
  lysp_qname *local_1a0;
  lysp_ext_instance *local_160;
  char *local_128;
  undefined8 local_110;
  ulong local_f8;
  lysp_qname *local_f0;
  lysp_ext_instance *local_e0;
  undefined8 local_d0;
  ulong local_b8;
  long *plStack_a8;
  LY_ERR ret__;
  char *p___3;
  uint64_t __new_start;
  uint64_t __u;
  char *p___2;
  char *p___1;
  char *p__;
  uint64_t c__;
  uint32_t *num;
  lysp_restr *must;
  lysp_restr **musts;
  lysp_qname *qname;
  uint64_t u;
  lysp_module *orig_pmod;
  lys_module *orig_mod;
  LY_ERR ret;
  lysp_node *target_local;
  lysp_module *rfn_pmod_local;
  lysp_refine *rfn_local;
  lysc_ctx *ctx_local;
  
  orig_mod._4_4_ = LY_SUCCESS;
  plVar2 = ctx->cur_mod;
  plVar3 = ctx->pmod;
  ctx->cur_mod = rfn_pmod->mod;
  ctx->pmod = rfn_pmod;
  lysc_update_path(ctx,(lys_module *)0x0,"{refine}");
  lysc_update_path(ctx,(lys_module *)0x0,rfn->nodeid);
  if (rfn->dflts != (lysp_qname *)0x0) {
    uVar1 = target->nodetype;
    if (uVar1 == 2) {
      if (rfn->dflts == (lysp_qname *)0x0) {
        local_f8 = 0;
      }
      else {
        local_f8 = *(ulong *)&rfn->dflts[-1].flags;
      }
      if (1 < local_f8) {
        plVar4 = ctx->ctx;
        pcVar11 = lys_nodetype2str(target->nodetype);
        if (rfn->dflts == (lysp_qname *)0x0) {
          local_110 = 0;
        }
        else {
          local_110 = *(undefined8 *)&rfn->dflts[-1].flags;
        }
        ly_vlog(plVar4,(char *)0x0,LYVE_SEMANTICS,
                "Invalid %s of %s with too many (%lu) %s properties.","refine",pcVar11,local_110,
                "default");
        orig_mod._4_4_ = LY_EVALID;
        goto LAB_0017cddd;
      }
      lydict_remove(ctx->ctx,(char *)target[1].next);
      orig_mod._4_4_ = lysp_qname_dup(ctx->ctx,rfn->dflts,(lysp_qname *)&target[1].next);
    }
    else {
      if (uVar1 != 4) {
        if (uVar1 == 8) {
          if (1 < rfn->dflts->mod->version) {
            p__ = (char *)0x0;
            while( true ) {
              if (target[3].parent == (lysp_node *)0x0) {
                local_e0 = (lysp_ext_instance *)0x0;
              }
              else {
                local_e0 = target[3].parent[-1].exts;
              }
              if (local_e0 <= p__) break;
              lysp_qname_free(ctx->ctx,(lysp_qname *)(&(target[3].parent)->parent + (long)p__ * 3));
              p__ = p__ + 1;
            }
            if (target[3].parent != (lysp_node *)0x0) {
              free(&target[3].parent[-1].exts);
            }
            target[3].parent = (lysp_node *)0x0;
            qname = (lysp_qname *)0x0;
            do {
              if (rfn->dflts == (lysp_qname *)0x0) {
                local_f0 = (lysp_qname *)0x0;
              }
              else {
                local_f0 = *(lysp_qname **)&rfn->dflts[-1].flags;
              }
              if (local_f0 <= qname) goto LAB_0017c08a;
              if (target[3].parent == (lysp_node *)0x0) {
                p___1 = (char *)malloc(0x20);
                if (p___1 == (char *)0x0) {
                  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_apply_refine");
                  orig_mod._4_4_ = LY_EMEM;
                  goto LAB_0017cddd;
                }
                p___1[0] = '\x01';
                p___1[1] = '\0';
                p___1[2] = '\0';
                p___1[3] = '\0';
                p___1[4] = '\0';
                p___1[5] = '\0';
                p___1[6] = '\0';
                p___1[7] = '\0';
              }
              else {
                target[3].parent[-1].exts =
                     (lysp_ext_instance *)((long)&(target[3].parent[-1].exts)->name + 1);
                p___1 = (char *)realloc(&target[3].parent[-1].exts,
                                        (long)target[3].parent[-1].exts * 0x18 + 8);
                if (p___1 == (char *)0x0) {
                  target[3].parent[-1].exts =
                       (lysp_ext_instance *)((long)&target[3].parent[-1].exts[-1].exts + 7);
                  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_apply_refine");
                  orig_mod._4_4_ = LY_EMEM;
                  goto LAB_0017cddd;
                }
              }
              target[3].parent = (lysp_node *)(p___1 + 8);
              plVar10 = (lysp_qname *)
                        (&target[3].parent[2].ref + (long)&target[3].parent[-1].exts[-1].exts * 3);
              memset(plVar10,0,0x18);
              orig_mod._4_4_ = lysp_qname_dup(ctx->ctx,rfn->dflts + (long)qname,plVar10);
              if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
              qname = (lysp_qname *)((long)&qname->str + 1);
            } while( true );
          }
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "Invalid refine of default in leaf-list - the default statement is allowed only in YANG 1.1 modules."
                 );
          orig_mod._4_4_ = LY_EVALID;
        }
        else {
          plVar4 = ctx->ctx;
          pcVar11 = lys_nodetype2str(target->nodetype);
          ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
                  "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",
                  pcVar11,"replace","default");
          orig_mod._4_4_ = LY_EVALID;
        }
        goto LAB_0017cddd;
      }
      if (rfn->dflts == (lysp_qname *)0x0) {
        local_b8 = 0;
      }
      else {
        local_b8 = *(ulong *)&rfn->dflts[-1].flags;
      }
      if (1 < local_b8) {
        plVar4 = ctx->ctx;
        pcVar11 = lys_nodetype2str(target->nodetype);
        if (rfn->dflts == (lysp_qname *)0x0) {
          local_d0 = 0;
        }
        else {
          local_d0 = *(undefined8 *)&rfn->dflts[-1].flags;
        }
        ly_vlog(plVar4,(char *)0x0,LYVE_SEMANTICS,
                "Invalid %s of %s with too many (%lu) %s properties.","refine",pcVar11,local_d0,
                "default");
        orig_mod._4_4_ = LY_EVALID;
        goto LAB_0017cddd;
      }
      lydict_remove(ctx->ctx,(char *)target[3].parent);
      orig_mod._4_4_ = lysp_qname_dup(ctx->ctx,rfn->dflts,(lysp_qname *)(target + 3));
    }
    if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
  }
LAB_0017c08a:
  if (rfn->dsc != (char *)0x0) {
    lydict_remove(ctx->ctx,target->dsc);
    orig_mod._4_4_ = lydict_dup(ctx->ctx,rfn->dsc,&target->dsc);
    if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
  }
  if (rfn->ref != (char *)0x0) {
    lydict_remove(ctx->ctx,target->ref);
    orig_mod._4_4_ = lydict_dup(ctx->ctx,rfn->ref,&target->ref);
    if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
  }
  if ((rfn->flags & 3) != 0) {
    if ((ctx->compile_opts & 4) == 0) {
      target->flags = target->flags & 0xfffc;
      target->flags = target->flags | rfn->flags & 3;
    }
    else {
      if ((ctx->compile_opts & 0x3000) == 0) {
        local_128 = "a subtree ignoring config";
        if ((ctx->compile_opts & 0x4000) != 0) {
          local_128 = "notification";
        }
      }
      else {
        local_128 = "RPC/action";
      }
      ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,"Refining config inside %s has no effect (%s).",local_128,
             ctx->path);
    }
  }
  if ((rfn->flags & 0x60) != 0) {
    uVar1 = target->nodetype;
    if ((((uVar1 != 2) && (uVar1 != 4)) && (uVar1 != 0x20)) && (uVar1 != 0x60)) {
      plVar4 = ctx->ctx;
      pcVar11 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",pcVar11,
              "replace","mandatory");
      orig_mod._4_4_ = LY_EVALID;
      goto LAB_0017cddd;
    }
    target->flags = target->flags & 0xff9f;
    target->flags = target->flags | rfn->flags & 0x60;
  }
  if (rfn->presence != (char *)0x0) {
    if (target->nodetype != 1) {
      plVar4 = ctx->ctx;
      pcVar11 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",pcVar11,
              "replace","presence");
      orig_mod._4_4_ = LY_EVALID;
      goto LAB_0017cddd;
    }
    lydict_remove(ctx->ctx,(char *)target[1].next);
    orig_mod._4_4_ = lydict_dup(ctx->ctx,rfn->presence,(char **)&target[1].next);
    if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
  }
  if (rfn->musts == (lysp_restr *)0x0) {
LAB_0017c642:
    if ((rfn->flags & 0x200) != 0) {
      if (target->nodetype == 8) {
        plVar12 = target + 3;
      }
      else {
        if (target->nodetype != 0x10) {
          plVar4 = ctx->ctx;
          pcVar11 = lys_nodetype2str(target->nodetype);
          ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
                  "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",
                  pcVar11,"replace","min-elements");
          orig_mod._4_4_ = LY_EVALID;
          goto LAB_0017cddd;
        }
        plVar12 = target + 2;
      }
      c__ = (uint64_t)&plVar12->nodetype;
      *(uint32_t *)c__ = rfn->min;
    }
    if ((rfn->flags & 0x400) != 0) {
      if (target->nodetype == 8) {
        plVar12 = target + 3;
      }
      else {
        if (target->nodetype != 0x10) {
          plVar4 = ctx->ctx;
          pcVar11 = lys_nodetype2str(target->nodetype);
          ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
                  "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",
                  pcVar11,"replace","max-elements");
          orig_mod._4_4_ = LY_EVALID;
          goto LAB_0017cddd;
        }
        plVar12 = target + 2;
      }
      c__ = (uint64_t)&plVar12->field_0xc;
      *(uint32_t *)c__ = rfn->max;
    }
    if (rfn->iffeatures == (lysp_qname *)0x0) {
LAB_0017ca94:
      if (rfn->exts != (lysp_ext_instance *)0x0) {
        if (target->exts == (lysp_ext_instance *)0x0) {
          local_1a8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_1a8 = target->exts[-1].exts;
        }
        if (target->exts == (lysp_ext_instance *)0x0) {
          if (rfn->exts == (lysp_ext_instance *)0x0) {
            local_1c8 = (lysp_ext_instance *)0x0;
          }
          else {
            local_1c8 = rfn->exts[-1].exts;
          }
          plStack_a8 = (long *)calloc(1,(long)local_1c8 * 0x70 + 8);
          if (plStack_a8 == (long *)0x0) {
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine");
            return LY_EMEM;
          }
        }
        else {
          if (rfn->exts == (lysp_ext_instance *)0x0) {
            local_1c0 = (lysp_ext_instance *)0x0;
          }
          else {
            local_1c0 = rfn->exts[-1].exts;
          }
          plStack_a8 = (long *)realloc(&target->exts[-1].exts,
                                       ((long)&local_1c0->name +
                                       (long)&(target->exts[-1].exts)->name) * 0x70 + 8);
          if (plStack_a8 == (long *)0x0) {
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine");
            return LY_EMEM;
          }
        }
        target->exts = (lysp_ext_instance *)(plStack_a8 + 1);
        if (target->exts != (lysp_ext_instance *)0x0) {
          if (rfn->exts == (lysp_ext_instance *)0x0) {
            local_1d8 = (lysp_ext_instance *)0x0;
          }
          else {
            local_1d8 = rfn->exts[-1].exts;
          }
          memset(target->exts + *plStack_a8,0,(long)local_1d8 * 0x70);
        }
        __new_start = 0;
        while( true ) {
          if (rfn->exts == (lysp_ext_instance *)0x0) {
            local_1e8 = (lysp_ext_instance *)0x0;
          }
          else {
            local_1e8 = rfn->exts[-1].exts;
          }
          if (local_1e8 <= __new_start) break;
          target->exts[-1].exts = (lysp_ext_instance *)((long)&(target->exts[-1].exts)->name + 1);
          plVar4 = ctx->ctx;
          parent_stmt = lyplg_ext_nodetype2stmt(target->nodetype);
          LVar9 = lysp_ext_dup(plVar4,rfn_pmod,target,parent_stmt,rfn->exts + __new_start,
                               target->exts + (long)&local_1a8->name + __new_start);
          if (LVar9 != LY_SUCCESS) {
            return LVar9;
          }
          __new_start = __new_start + 1;
        }
      }
    }
    else {
      uVar8 = (uint)target->nodetype;
      if (((((uVar8 - 1 < 2) || (uVar8 == 4)) || (uVar8 == 8)) ||
          ((uVar8 == 0x10 || (uVar8 == 0x20)))) || ((uVar8 == 0x60 || (uVar8 == 0x80)))) {
        qname = (lysp_qname *)0x0;
        do {
          if (rfn->iffeatures == (lysp_qname *)0x0) {
            local_1a0 = (lysp_qname *)0x0;
          }
          else {
            local_1a0 = *(lysp_qname **)&rfn->iffeatures[-1].flags;
          }
          if (local_1a0 <= qname) goto LAB_0017ca94;
          if (target->iffeatures == (lysp_qname *)0x0) {
            __u = (uint64_t)malloc(0x20);
            if ((undefined8 *)__u == (undefined8 *)0x0) {
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine"
                    );
              orig_mod._4_4_ = LY_EMEM;
              goto LAB_0017cddd;
            }
            *(undefined8 *)__u = 1;
          }
          else {
            *(long *)&target->iffeatures[-1].flags = *(long *)&target->iffeatures[-1].flags + 1;
            __u = (uint64_t)
                  realloc(&target->iffeatures[-1].flags,
                          *(long *)&target->iffeatures[-1].flags * 0x18 + 8);
            if ((void *)__u == (void *)0x0) {
              *(long *)&target->iffeatures[-1].flags = *(long *)&target->iffeatures[-1].flags + -1;
              ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine"
                    );
              orig_mod._4_4_ = LY_EMEM;
              goto LAB_0017cddd;
            }
          }
          target->iffeatures = (lysp_qname *)(__u + 8);
          plVar10 = target->iffeatures;
          lVar7 = *(long *)&target->iffeatures[-1].flags;
          memset(plVar10 + lVar7 + -1,0,0x18);
          orig_mod._4_4_ =
               lysp_qname_dup(ctx->ctx,rfn->iffeatures + (long)qname,plVar10 + lVar7 + -1);
          if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
          qname = (lysp_qname *)((long)&qname->str + 1);
        } while( true );
      }
      plVar4 = ctx->ctx;
      pcVar11 = lys_nodetype2str(target->nodetype);
      ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
              "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",pcVar11,
              "add","if-feature");
      orig_mod._4_4_ = LY_EVALID;
    }
  }
  else {
    uVar1 = target->nodetype;
    if ((((uVar1 == 1) || (uVar1 == 4)) || ((uVar1 == 8 || ((uVar1 == 0x10 || (uVar1 == 0x20))))))
       || (uVar1 == 0x60)) {
      plVar12 = target + 1;
      qname = (lysp_qname *)0x0;
      do {
        if (rfn->musts == (lysp_restr *)0x0) {
          local_160 = (lysp_ext_instance *)0x0;
        }
        else {
          local_160 = rfn->musts[-1].exts;
        }
        if (local_160 <= qname) goto LAB_0017c642;
        if (plVar12->parent == (lysp_node *)0x0) {
          p___2 = (char *)malloc(0x48);
          if (p___2 == (char *)0x0) {
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine");
            orig_mod._4_4_ = LY_EMEM;
            goto LAB_0017cddd;
          }
          p___2[0] = '\x01';
          p___2[1] = '\0';
          p___2[2] = '\0';
          p___2[3] = '\0';
          p___2[4] = '\0';
          p___2[5] = '\0';
          p___2[6] = '\0';
          p___2[7] = '\0';
        }
        else {
          plVar12->parent[-1].exts =
               (lysp_ext_instance *)((long)&(plVar12->parent[-1].exts)->name + 1);
          p___2 = (char *)realloc(&plVar12->parent[-1].exts,
                                  (long)plVar12->parent[-1].exts * 0x40 + 8);
          if (p___2 == (char *)0x0) {
            plVar12->parent[-1].exts =
                 (lysp_ext_instance *)((long)&plVar12->parent[-1].exts[-1].exts + 7);
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine");
            orig_mod._4_4_ = LY_EMEM;
            goto LAB_0017cddd;
          }
        }
        plVar12->parent = (lysp_node *)(p___2 + 8);
        plVar5 = plVar12->parent;
        plVar6 = plVar12->parent[-1].exts;
        memset(plVar5 + (long)((long)&plVar6[-1].exts + 7),0,0x40);
        orig_mod._4_4_ =
             lysp_restr_dup(ctx->ctx,rfn_pmod,rfn->musts + (long)qname,
                            (lysp_restr *)(plVar5 + (long)((long)&plVar6[-1].exts + 7)));
        if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017cddd;
        qname = (lysp_qname *)((long)&qname->str + 1);
      } while( true );
    }
    plVar4 = ctx->ctx;
    pcVar11 = lys_nodetype2str(target->nodetype);
    ly_vlog(plVar4,(char *)0x0,LYVE_REFERENCE,
            "Invalid %s of %s node - it is not possible to %s \"%s\" property.","refine",pcVar11,
            "add","must");
    orig_mod._4_4_ = LY_EVALID;
  }
LAB_0017cddd:
  ctx->cur_mod = plVar2;
  ctx->pmod = plVar3;
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return orig_mod._4_4_;
}

Assistant:

static LY_ERR
lys_apply_refine(struct lysc_ctx *ctx, struct lysp_refine *rfn, const struct lysp_module *rfn_pmod, struct lysp_node *target)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_module *orig_mod = ctx->cur_mod;
    struct lysp_module *orig_pmod = ctx->pmod;
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_qname *qname;
    struct lysp_restr **musts, *must;
    uint32_t *num;

    /* use module from the refine */
    ctx->cur_mod = rfn_pmod->mod;
    ctx->pmod = (struct lysp_module *)rfn_pmod;

    /* keep the current path and add to it */
    lysc_update_path(ctx, NULL, "{refine}");
    lysc_update_path(ctx, NULL, rfn->nodeid);

    /* default value */
    if (rfn->dflts) {
        switch (target->nodetype) {
        case LYS_LEAF:
            AMEND_CHECK_CARDINALITY(rfn->dflts, 1, "refine", "default");

            lydict_remove(ctx->ctx, ((struct lysp_node_leaf *)target)->dflt.str);
            LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &rfn->dflts[0], &((struct lysp_node_leaf *)target)->dflt), cleanup);
            break;
        case LYS_LEAFLIST:
            if (rfn->dflts[0].mod->version < LYS_VERSION_1_1) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "Invalid refine of default in leaf-list - the default statement is allowed only in YANG 1.1 modules.");
                ret = LY_EVALID;
                goto cleanup;
            }

            FREE_ARRAY(ctx->ctx, ((struct lysp_node_leaflist *)target)->dflts, lysp_qname_free);
            ((struct lysp_node_leaflist *)target)->dflts = NULL;
            LY_ARRAY_FOR(rfn->dflts, u) {
                LY_ARRAY_NEW_GOTO(ctx->ctx, ((struct lysp_node_leaflist *)target)->dflts, qname, ret, cleanup);
                LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &rfn->dflts[u], qname), cleanup);
            }
            break;
        case LYS_CHOICE:
            AMEND_CHECK_CARDINALITY(rfn->dflts, 1, "refine", "default");

            lydict_remove(ctx->ctx, ((struct lysp_node_choice *)target)->dflt.str);
            LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &rfn->dflts[0], &((struct lysp_node_choice *)target)->dflt), cleanup);
            break;
        default:
            AMEND_WRONG_NODETYPE("refine", "replace", "default");
        }
    }

    /* description */
    if (rfn->dsc) {
        lydict_remove(ctx->ctx, target->dsc);
        DUP_STRING_GOTO(ctx->ctx, rfn->dsc, target->dsc, ret, cleanup);
    }

    /* reference */
    if (rfn->ref) {
        lydict_remove(ctx->ctx, target->ref);
        DUP_STRING_GOTO(ctx->ctx, rfn->ref, target->ref, ret, cleanup);
    }

    /* config */
    if (rfn->flags & LYS_CONFIG_MASK) {
        if (ctx->compile_opts & LYS_COMPILE_NO_CONFIG) {
            LOGWRN(ctx->ctx, "Refining config inside %s has no effect (%s).",
                    (ctx->compile_opts & (LYS_IS_INPUT | LYS_IS_OUTPUT)) ? "RPC/action" :
                    ctx->compile_opts & LYS_IS_NOTIF ? "notification" : "a subtree ignoring config", ctx->path);
        } else {
            target->flags &= ~LYS_CONFIG_MASK;
            target->flags |= rfn->flags & LYS_CONFIG_MASK;
        }
    }

    /* mandatory */
    if (rfn->flags & LYS_MAND_MASK) {
        switch (target->nodetype) {
        case LYS_LEAF:
        case LYS_CHOICE:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            break;
        default:
            AMEND_WRONG_NODETYPE("refine", "replace", "mandatory");
        }

        target->flags &= ~LYS_MAND_MASK;
        target->flags |= rfn->flags & LYS_MAND_MASK;
    }

    /* presence */
    if (rfn->presence) {
        if (target->nodetype != LYS_CONTAINER) {
            AMEND_WRONG_NODETYPE("refine", "replace", "presence");
        }

        lydict_remove(ctx->ctx, ((struct lysp_node_container *)target)->presence);
        DUP_STRING_GOTO(ctx->ctx, rfn->presence, ((struct lysp_node_container *)target)->presence, ret, cleanup);
    }

    /* must */
    if (rfn->musts) {
        switch (target->nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_LEAF:
        case LYS_LEAFLIST:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            musts = &((struct lysp_node_container *)target)->musts;
            break;
        default:
            AMEND_WRONG_NODETYPE("refine", "add", "must");
        }

        LY_ARRAY_FOR(rfn->musts, u) {
            LY_ARRAY_NEW_GOTO(ctx->ctx, *musts, must, ret, cleanup);
            LY_CHECK_GOTO(ret = lysp_restr_dup(ctx->ctx, rfn_pmod, &rfn->musts[u], must), cleanup);
        }
    }

    /* min-elements */
    if (rfn->flags & LYS_SET_MIN) {
        switch (target->nodetype) {
        case LYS_LEAFLIST:
            num = &((struct lysp_node_leaflist *)target)->min;
            break;
        case LYS_LIST:
            num = &((struct lysp_node_list *)target)->min;
            break;
        default:
            AMEND_WRONG_NODETYPE("refine", "replace", "min-elements");
        }

        *num = rfn->min;
    }

    /* max-elements */
    if (rfn->flags & LYS_SET_MAX) {
        switch (target->nodetype) {
        case LYS_LEAFLIST:
            num = &((struct lysp_node_leaflist *)target)->max;
            break;
        case LYS_LIST:
            num = &((struct lysp_node_list *)target)->max;
            break;
        default:
            AMEND_WRONG_NODETYPE("refine", "replace", "max-elements");
        }

        *num = rfn->max;
    }

    /* if-feature */
    if (rfn->iffeatures) {
        switch (target->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
        case LYS_LIST:
        case LYS_CONTAINER:
        case LYS_CHOICE:
        case LYS_CASE:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            break;
        default:
            AMEND_WRONG_NODETYPE("refine", "add", "if-feature");
        }

        LY_ARRAY_FOR(rfn->iffeatures, u) {
            LY_ARRAY_NEW_GOTO(ctx->ctx, target->iffeatures, qname, ret, cleanup);
            LY_CHECK_GOTO(ret = lysp_qname_dup(ctx->ctx, &rfn->iffeatures[u], qname), cleanup);
        }
    }

    /* extension instances */
    DUP_EXTS(ctx->ctx, rfn_pmod, target, lyplg_ext_nodetype2stmt(target->nodetype), rfn->exts, target->exts, lysp_ext_dup);

cleanup:
    ctx->cur_mod = orig_mod;
    ctx->pmod = orig_pmod;

    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);
    return ret;
}